

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropagatorTest.cpp
# Opt level: O2

string * __thiscall
jaegertracing::propagation::(anonymous_namespace)::
randomStr<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *gen)

{
  ulong uVar1;
  ulong uVar2;
  size_t i;
  ulong uVar3;
  
  uVar1 = (ulong)(*(long *)this * 0x41a7) % 0x7fffffff;
  *(ulong *)this = uVar1;
  uVar1 = uVar1 % 10;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)uVar1);
  for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
    uVar2 = (ulong)(*(long *)this * 0x41a7) % 0x7fffffff;
    *(ulong *)this = uVar2;
    (__return_storage_ptr__->_M_dataplus)._M_p[uVar3] =
         "abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ0123456789"[uVar2 % 0x3e];
  }
  return __return_storage_ptr__;
}

Assistant:

std::string randomStr(RandomGenerator& gen)
{
    constexpr auto kMaxSize = 10;
    static constexpr char kLetters[] =
        "abcdefghijklmnopqrstuvwxyz"
        "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
        "0123456789";
    constexpr auto kNumLetters = sizeof(kLetters) - 1;
    const auto size = gen() % kMaxSize;
    std::string result(size, '\0');
    for (auto i = static_cast<size_t>(0); i < size; ++i) {
        const auto pos = gen() % kNumLetters;
        result[i] = kLetters[pos];
    }
    return result;
}